

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error __thiscall ald::size(ald *this,context *ctx,token *token,opcode *op)

{
  ulong uVar1;
  string_view prefix;
  optional<unsigned_long> oVar2;
  token local_58;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar2 = find_in_table(token,size::table,prefix);
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    uVar1 = 0;
  }
  else {
    context::tokenize(&local_58,ctx);
    token->column = local_58.column;
    (token->data).string._M_str = local_58.data.string._M_str;
    token->type = local_58.type;
    token->line = local_58.line;
    token->filename = local_58.filename;
    (token->data).predicate = local_58.data.predicate;
    uVar1 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload << 0x2f;
  }
  if ((op->value & uVar1) == 0) {
    op->value = op->value | uVar1;
    *(undefined8 *)this = 0;
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)this;
  }
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
}

Assistant:

DEFINE_OPERAND(imm_attr)
    {
        if (!equal(token, "a")) {
            return fail(token, "expected 'a'");
        }
        token = ctx.tokenize();

        CHECK(confirm_type(token, token_type::bracket_left));
        token = ctx.tokenize();

        CHECK((uinteger<10, 20>(ctx, token, op)));
        op.add_bits(0xFFULL << 8);

        CHECK(confirm_type(token, token_type::bracket_right));
        token = ctx.tokenize();
        return {};
    }